

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int ncnn::reduction_post_process<ncnn::post_process_identity<float>>(Mat *a,float coeff,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  void *pvVar4;
  uint uVar5;
  void *pvVar6;
  ulong uVar7;
  void *pvVar8;
  
  uVar5 = a->dims;
  pvVar4 = (void *)(ulong)uVar5;
  if (uVar5 == 3) {
    uVar5 = a->c;
    uVar3 = a->h * a->w;
    pvVar4 = (void *)(ulong)uVar3;
    if ((ulong)uVar5 == 1) {
      if (0 < (int)uVar3) {
        pvVar8 = a->data;
        pvVar6 = (void *)0x0;
        do {
          *(float *)((long)pvVar8 + (long)pvVar6 * 4) =
               *(float *)((long)pvVar8 + (long)pvVar6 * 4) * coeff;
          pvVar6 = (void *)((long)pvVar6 + 1);
        } while (pvVar4 != pvVar6);
      }
    }
    else if (0 < (int)uVar5) {
      pvVar8 = a->data;
      sVar1 = a->cstep;
      sVar2 = a->elemsize;
      uVar7 = 0;
      do {
        if (0 < (int)uVar3) {
          pvVar6 = (void *)0x0;
          do {
            *(float *)((long)pvVar8 + (long)pvVar6 * 4) =
                 *(float *)((long)pvVar8 + (long)pvVar6 * 4) * coeff;
            pvVar6 = (void *)((long)pvVar6 + 1);
          } while (pvVar4 != pvVar6);
        }
        uVar7 = uVar7 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar1 * sVar2);
      } while (uVar7 != uVar5);
    }
  }
  else if (uVar5 == 2) {
    uVar5 = a->h * a->w;
    if (0 < (int)uVar5) {
      pvVar4 = a->data;
      uVar7 = 0;
      do {
        *(float *)((long)pvVar4 + uVar7 * 4) = *(float *)((long)pvVar4 + uVar7 * 4) * coeff;
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
    }
  }
  else if ((uVar5 == 1) && (pvVar4 = (void *)(long)a->w, 0 < (long)pvVar4)) {
    pvVar8 = a->data;
    pvVar6 = (void *)0x0;
    do {
      *(float *)((long)pvVar8 + (long)pvVar6 * 4) =
           *(float *)((long)pvVar8 + (long)pvVar6 * 4) * coeff;
      pvVar6 = (void *)((long)pvVar6 + 1);
    } while (pvVar4 != pvVar6);
  }
  return (int)pvVar4;
}

Assistant:

static int reduction_post_process(Mat& a, float coeff, const Option& opt)
{
    MathOp mathop;

    int dims = a.dims;
    if (dims == 1)
    {
        int w = a.w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<w; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 2)
    {
        int size = a.w * a.h;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<size; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 3)
    {
        int c = a.c;
        int size = a.w * a.h;
        if(c == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
                a[i] = mathop(a[i]) * coeff;
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for(int q=0; q<c; q++)
            {
                float* outptr = a.channel(q);
                for (int i=0; i<size; i++)
                    outptr[i] = mathop(outptr[i]) * coeff;
            }
        }
    }
    
    return 0;
}